

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltException.cpp
# Opt level: O0

void __thiscall NoViableAltException::NoViableAltException(NoViableAltException *this,RefToken *t)

{
  int iVar1;
  Token *pTVar2;
  RefCount<AST> *in_RSI;
  undefined8 *in_RDI;
  string *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  RefCount<Token> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  AST *p;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"NoViableAlt",&local_31);
  ParserException::ParserException
            ((ParserException *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  *in_RDI = &PTR__NoViableAltException_0036cab0;
  p = (AST *)(in_RDI + 6);
  RefCount<Token>::RefCount
            ((RefCount<Token> *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff78);
  RefCount<AST>::RefCount(in_RSI,p);
  pTVar2 = RefCount<Token>::operator->((RefCount<Token> *)in_RSI);
  iVar1 = (*pTVar2->_vptr_Token[1])();
  *(int *)(in_RDI + 5) = iVar1;
  pTVar2 = RefCount<Token>::operator->((RefCount<Token> *)in_RSI);
  iVar1 = (**pTVar2->_vptr_Token)();
  *(int *)((long)in_RDI + 0x2c) = iVar1;
  return;
}

Assistant:

NoViableAltException::NoViableAltException(RefToken t)
: ParserException("NoViableAlt") // line ")+t.getLine()+" token is "+t.getText())
, token(t)
, node(0)
{
	line = t->getLine();
	column = t->getColumn();
}